

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O3

AnalysisState __thiscall HttpData::analysisRequest(HttpData *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *this_01;
  char *pcVar1;
  size_t __n;
  _Alloc_hider __n_00;
  uint uVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pcVar7;
  void *pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  AnalysisState AVar12;
  undefined8 uVar13;
  HttpData *pHVar14;
  element_type *peVar15;
  ulong uVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  bool bVar19;
  size_type __dnew;
  string __str_1;
  string filetype;
  string header;
  string __str;
  stat sbuf;
  key_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  key_type local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ulong local_128;
  undefined1 local_120 [48];
  ulong local_f0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  
  if ((this->method_ & ~METHOD_POST) != METHOD_GET) {
    return ANALYSIS_ERROR;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_168,"HTTP/1.1 200 OK\r\n");
  pcVar1 = local_120 + 0x10;
  local_120._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Connection","");
  this_00 = &this->headers_;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_120);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->headers_)._M_t._M_impl.super__Rb_tree_header) {
    bVar19 = false;
  }
  else {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Connection","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_188);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (pmVar5,"Keep-Alive");
    bVar19 = true;
    if (iVar3 != 0) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Connection","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_1d0);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(pmVar5,"keep-alive");
      bVar19 = iVar3 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char *)local_120._0_8_ != pcVar1) {
    operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
  }
  if (bVar19) {
    this->keepAlive_ = true;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"Connection: Keep-Alive\r\n","");
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1a8,"Keep-Alive: timeout=");
    paVar18 = &local_1d0.field_2;
    local_1d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == paVar9) {
      local_1d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_1d0._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_1d0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    paVar9 = &local_148.field_2;
    local_148._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_148,6,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_148._M_dataplus._M_p,6,300000);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar18) {
      uVar13 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_148._M_string_length + local_1d0._M_string_length) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar9) {
        uVar13 = local_148.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_148._M_string_length + local_1d0._M_string_length)
      goto LAB_00109721;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_148,0,0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    }
    else {
LAB_00109721:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_1d0,local_148._M_dataplus._M_p,local_148._M_string_length);
    }
    local_188._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar10 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == paVar10) {
      local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_188.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_188._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar6->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_188,"\r\n");
    local_120._0_8_ = (pbVar6->_M_dataplus)._M_p;
    paVar10 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ == paVar10) {
      local_120._16_8_ = paVar10->_M_allocated_capacity;
      local_120._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_120._0_8_ = pcVar1;
    }
    else {
      local_120._16_8_ = paVar10->_M_allocated_capacity;
    }
    local_120._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_168,(char *)local_120._0_8_,local_120._8_8_);
    if ((char *)local_120._0_8_ != pcVar1) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar9) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar18) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = &this->fileName_;
  __n = (this->fileName_)._M_string_length;
  if (__n == 0) {
    local_188.field_2._M_allocated_capacity =
         local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00109971:
    local_1b0 = &local_188.field_2;
    local_188._M_string_length = 0;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_188._M_dataplus._M_p = (pointer)local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"default","");
    MimeType::getMime((string *)local_120,&local_1d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    if ((char *)local_120._0_8_ != pcVar1) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
    paVar18 = local_1b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      paVar18 = local_1b0;
    }
  }
  else {
    pcVar7 = (this_01->_M_dataplus)._M_p;
    pvVar8 = memchr(pcVar7,0x2e,__n);
    uVar17 = -(uint)(pvVar8 == (void *)0x0) | (int)pvVar8 - (int)pcVar7;
    paVar18 = &local_188.field_2;
    local_188._M_string_length = 0;
    local_188.field_2._M_allocated_capacity =
         local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((int)uVar17 < 0) goto LAB_00109971;
    local_188._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1d0,this_01,(ulong)(uVar17 & 0x7fffffff),0xffffffffffffffff);
    MimeType::getMime((string *)local_120,&local_1d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    if ((char *)local_120._0_8_ != pcVar1) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_01,"hello");
  if (iVar3 == 0) {
    AVar12 = ANALYSIS_SUCCESS;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->outBuffer_,0,(this->outBuffer_)._M_string_length,
               "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World",0x38);
    goto LAB_0010a194;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_01,"favicon.ico");
  if (iVar3 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_168,"Content-Type: image/png\r\n");
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_1a8,3,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1a8._M_dataplus._M_p,(uint)local_1a8._M_string_length,0x22b);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1a8,0,0,"Content-Length: ",0x10);
    local_1d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == paVar9) {
      local_1d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_1d0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1d0,"\r\n");
    local_120._0_8_ = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ == paVar9) {
      local_120._16_8_ = paVar9->_M_allocated_capacity;
      local_120._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_120._0_8_ = pcVar1;
    }
    else {
      local_120._16_8_ = paVar9->_M_allocated_capacity;
    }
    local_120._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_168,(char *)local_120._0_8_,local_120._8_8_);
    if ((char *)local_120._0_8_ != pcVar1) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_168,"Server: LinYa\'s Web Server\r\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_168,"\r\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&this->outBuffer_,local_168._M_dataplus._M_p,local_168._M_string_length);
    local_1d0._M_dataplus._M_p = (pointer)0x22b;
    local_120._0_8_ = pcVar1;
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,(size_type *)&local_1d0,0);
    __n_00._M_p = local_1d0._M_dataplus._M_p;
    local_120._16_8_ = local_1d0._M_dataplus._M_p;
    local_120._0_8_ = pcVar7;
    memcpy(pcVar7,favicon,0x22b);
    local_120._8_8_ = __n_00._M_p;
    pcVar7[__n_00._M_p] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&this->outBuffer_,(char *)local_120._0_8_,(size_type)__n_00._M_p);
    if ((char *)local_120._0_8_ != pcVar1) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
LAB_0010a09a:
    AVar12 = ANALYSIS_SUCCESS;
  }
  else {
    iVar3 = stat((this_01->_M_dataplus)._M_p,(stat *)local_120);
    if (iVar3 < 0) {
      local_168._M_string_length = 0;
      *local_168._M_dataplus._M_p = '\0';
      iVar3 = this->fd_;
      pHVar14 = (HttpData *)local_50;
      local_50._0_8_ = (element_type *)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>((string *)pHVar14,"Not Found!","");
      handleError(pHVar14,iVar3,0x194,(string *)local_50);
      AVar12 = ANALYSIS_ERROR;
      peVar15 = (element_type *)local_50._0_8_;
      if ((element_type *)local_50._0_8_ == (element_type *)&stack0xffffffffffffffc0)
      goto LAB_0010a194;
    }
    else {
      local_1b0 = paVar18;
      std::operator+(&local_1a8,"Content-Type: ",&local_188);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1a8,"\r\n");
      local_1d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar18 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p == paVar18) {
        local_1d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_1d0._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_168,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      uVar16 = -local_f0;
      if (0 < (long)local_f0) {
        uVar16 = local_f0;
      }
      uVar17 = 1;
      if (9 < uVar16) {
        uVar11 = uVar16;
        uVar2 = 4;
        do {
          uVar17 = uVar2;
          if (uVar11 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_00109e4a;
          }
          if (uVar11 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_00109e4a;
          }
          if (uVar11 < 10000) goto LAB_00109e4a;
          bVar19 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar2 = uVar17 + 4;
        } while (bVar19);
        uVar17 = uVar17 + 1;
      }
LAB_00109e4a:
      local_128 = local_f0;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_148,(ulong)(uVar17 - (int)((long)local_f0 >> 0x3f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_148._M_dataplus._M_p + -((long)local_f0 >> 0x3f),uVar17,uVar16);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_148,0,0,"Content-Length: ",0x10);
      paVar18 = local_1b0;
      local_1a8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar10 = &pbVar6->field_2;
      paVar9 = &local_1d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p == paVar10) {
        local_1a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_1a8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1a8,"\r\n");
      local_1d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar10 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p == paVar10) {
        local_1d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1d0._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_1d0._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_168,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar9) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_168,"Server: LinYa\'s Web Server\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_168,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&this->outBuffer_,local_168._M_dataplus._M_p,local_168._M_string_length);
      AVar12 = ANALYSIS_SUCCESS;
      if (this->method_ == METHOD_HEAD) goto LAB_0010a194;
      iVar3 = open((this_01->_M_dataplus)._M_p,0,0);
      if (iVar3 < 0) {
        (this->outBuffer_)._M_string_length = 0;
        *(this->outBuffer_)._M_dataplus._M_p = '\0';
        iVar3 = this->fd_;
        pHVar14 = (HttpData *)local_70;
        local_70._0_8_ = (element_type *)local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)pHVar14,"Not Found!","");
        handleError(pHVar14,iVar3,0x194,(string *)local_70);
        AVar12 = ANALYSIS_ERROR;
        local_40 = local_60._0_8_;
        peVar15 = (element_type *)local_70._0_8_;
        if ((element_type *)local_70._0_8_ == (element_type *)local_60) goto LAB_0010a194;
      }
      else {
        pvVar8 = mmap((void *)0x0,local_128,1,2,iVar3,0);
        close(iVar3);
        uVar16 = local_128;
        if (pvVar8 != (void *)0xffffffffffffffff) {
          local_1d0._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,pvVar8,(long)pvVar8 + local_128);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&this->outBuffer_,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar9) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          munmap(pvVar8,uVar16);
          goto LAB_0010a09a;
        }
        munmap((void *)0xffffffffffffffff,local_128);
        (this->outBuffer_)._M_string_length = 0;
        *(this->outBuffer_)._M_dataplus._M_p = '\0';
        iVar3 = this->fd_;
        pHVar14 = (HttpData *)local_90;
        local_90._0_8_ = (element_type *)local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)pHVar14,"Not Found!","");
        handleError(pHVar14,iVar3,0x194,(string *)local_90);
        AVar12 = ANALYSIS_ERROR;
        local_40 = local_80._0_8_;
        peVar15 = (element_type *)local_90._0_8_;
        if ((element_type *)local_90._0_8_ == (element_type *)local_80) goto LAB_0010a194;
      }
    }
    AVar12 = ANALYSIS_ERROR;
    operator_delete(peVar15,(ulong)((long)&(((element_type *)local_40)->
                                           super_enable_shared_from_this<HttpData>)._M_weak_this.
                                           super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 1));
  }
LAB_0010a194:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar18) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  return AVar12;
}

Assistant:

AnalysisState HttpData::analysisRequest() {
  if (method_ == METHOD_POST) {
    // ------------------------------------------------------
    // My CV stitching handler which requires OpenCV library
    // ------------------------------------------------------
    // string header;
    // header += string("HTTP/1.1 200 OK\r\n");
    // if(headers_.find("Connection") != headers_.end() &&
    // headers_["Connection"] == "Keep-Alive")
    // {
    //     keepAlive_ = true;
    //     header += string("Connection: Keep-Alive\r\n") + "Keep-Alive:
    //     timeout=" + to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    // }
    // int length = stoi(headers_["Content-length"]);
    // vector<char> data(inBuffer_.begin(), inBuffer_.begin() + length);
    // Mat src = imdecode(data, CV_LOAD_IMAGE_ANYDEPTH|CV_LOAD_IMAGE_ANYCOLOR);
    // //imwrite("receive.bmp", src);
    // Mat res = stitch(src);
    // vector<uchar> data_encode;
    // imencode(".png", res, data_encode);
    // header += string("Content-length: ") + to_string(data_encode.size()) +
    // "\r\n\r\n";
    // outBuffer_ += header + string(data_encode.begin(), data_encode.end());
    // inBuffer_ = inBuffer_.substr(length);
    // return ANALYSIS_SUCCESS;
  } else if (method_ == METHOD_GET || method_ == METHOD_HEAD) {
    string header;
    header += "HTTP/1.1 200 OK\r\n";
    if (headers_.find("Connection") != headers_.end() &&
        (headers_["Connection"] == "Keep-Alive" ||
         headers_["Connection"] == "keep-alive")) {
      keepAlive_ = true;
      header += string("Connection: Keep-Alive\r\n") + "Keep-Alive: timeout=" +
                to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    }
    int dot_pos = fileName_.find('.');
    string filetype;
    if (dot_pos < 0)
      filetype = MimeType::getMime("default");
    else
      filetype = MimeType::getMime(fileName_.substr(dot_pos));

    // echo test
    if (fileName_ == "hello") {
      outBuffer_ =
          "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World";
      return ANALYSIS_SUCCESS;
    }
    if (fileName_ == "favicon.ico") {
      header += "Content-Type: image/png\r\n";
      header += "Content-Length: " + to_string(sizeof favicon) + "\r\n";
      header += "Server: LinYa's Web Server\r\n";

      header += "\r\n";
      outBuffer_ += header;
      outBuffer_ += string(favicon, favicon + sizeof favicon);
      ;
      return ANALYSIS_SUCCESS;
    }

    struct stat sbuf;
    if (stat(fileName_.c_str(), &sbuf) < 0) {
      header.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    header += "Content-Type: " + filetype + "\r\n";
    header += "Content-Length: " + to_string(sbuf.st_size) + "\r\n";
    header += "Server: LinYa's Web Server\r\n";
    // 头部结束
    header += "\r\n";
    outBuffer_ += header;

    if (method_ == METHOD_HEAD) return ANALYSIS_SUCCESS;

    int src_fd = open(fileName_.c_str(), O_RDONLY, 0);
    if (src_fd < 0) {
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    void *mmapRet = mmap(NULL, sbuf.st_size, PROT_READ, MAP_PRIVATE, src_fd, 0);
    close(src_fd);
    if (mmapRet == (void *)-1) {
      munmap(mmapRet, sbuf.st_size);
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    char *src_addr = static_cast<char *>(mmapRet);
    outBuffer_ += string(src_addr, src_addr + sbuf.st_size);
    ;
    munmap(mmapRet, sbuf.st_size);
    return ANALYSIS_SUCCESS;
  }
  return ANALYSIS_ERROR;
}